

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupFlip(Gia_Man_t *p,int *pInitState)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar12 = 1;
    lVar13 = 0;
    do {
      pGVar2 = p->pObjs;
      uVar3 = *(ulong *)(&pGVar2[1].field_0x0 + lVar13);
      uVar10 = (uint)uVar3;
      iVar5 = (int)(uVar3 & 0x1fffffff);
      uVar6 = (uint)(uVar3 >> 0x20);
      if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar10 < 0) {
        if ((uVar10 & 0x9fffffff) == 0x9fffffff) {
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar3 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar3 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_001d90c7:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_001d90c7;
          uVar6 = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
          *(uint *)((long)&pGVar2[1].Value + lVar13) = uVar6;
          if (-1 < (int)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar13)) {
LAB_001d90e6:
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar10 = (uint)((ulong)*(undefined8 *)(&pGVar2[1].field_0x0 + lVar13) >> 0x20) &
                   0x1fffffff;
          iVar5 = p->vCis->nSize - p->nRegs;
          uVar11 = uVar10 - iVar5;
          if (iVar5 <= (int)uVar10) {
            if ((int)uVar6 < 0) goto LAB_001d90a8;
            *(uint *)((long)&pGVar2[1].Value + lVar13) =
                 ((uint)pInitState[(int)uVar11 >> 5] >> (uVar11 & 0x1f) & 1) != 0 | uVar6;
          }
        }
        else if ((int)uVar10 < 0 && iVar5 != 0x1fffffff) {
          uVar11 = *(uint *)((long)pGVar2 + lVar13 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
          if ((int)uVar11 < 0) goto LAB_001d90a8;
          uVar11 = uVar11 ^ (uint)(uVar3 >> 0x1d) & 1;
          *(uint *)((long)&pGVar2[1].Value + lVar13) = uVar11;
          if (-1 < (int)uVar10) goto LAB_001d90e6;
          uVar6 = uVar6 & 0x1fffffff;
          iVar5 = p->vCos->nSize - p->nRegs;
          uVar10 = uVar6 - iVar5;
          if (iVar5 <= (int)uVar6) {
            *(uint *)((long)&pGVar2[1].Value + lVar13) =
                 ((uint)pInitState[(int)uVar10 >> 5] >> (uVar10 & 0x1f) & 1) != 0 ^ uVar11;
          }
          iVar5 = Gia_ManAppendCo(p_00,*(int *)((long)&pGVar2[1].Value + lVar13));
          goto LAB_001d8ec1;
        }
      }
      else {
        uVar10 = *(uint *)((long)pGVar2 + lVar13 + (ulong)(uint)(iVar5 << 2) * -3 + 0x14);
        if (((int)uVar10 < 0) ||
           (uVar11 = *(uint *)((long)pGVar2 +
                              lVar13 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + 0x14),
           (int)uVar11 < 0)) {
LAB_001d90a8:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar5 = Gia_ManAppendAnd(p_00,uVar10 ^ (uint)(uVar3 >> 0x1d) & 1,uVar11 ^ uVar6 >> 0x1d & 1)
        ;
LAB_001d8ec1:
        *(int *)((long)&pGVar2[1].Value + lVar13) = iVar5;
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar12 < p->nObjs);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFlip( Gia_Man_t * p, int * pInitState )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            if ( Gia_ObjCioId(pObj) >= Gia_ManPiNum(p) )
                pObj->Value = Abc_LitNotCond( pObj->Value, Abc_InfoHasBit((unsigned *)pInitState, Gia_ObjCioId(pObj) - Gia_ManPiNum(p)) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ObjFanin0Copy(pObj);
            if ( Gia_ObjCioId(pObj) >= Gia_ManPoNum(p) )
                pObj->Value = Abc_LitNotCond( pObj->Value, Abc_InfoHasBit((unsigned *)pInitState, Gia_ObjCioId(pObj) - Gia_ManPoNum(p)) );
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}